

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O1

long __thiscall libtorrent::aux::random(aux *this)

{
  result_type_conflict rVar1;
  mt19937 *__urng;
  undefined4 extraout_var;
  uniform_int_distribution<unsigned_int> local_10;
  
  local_10._M_param._M_b = (uint)this;
  if (local_10._M_param._M_b != 0) {
    local_10._M_param._M_a = 0;
    __urng = random_engine();
    rVar1 = ::std::uniform_int_distribution<unsigned_int>::operator()
                      (&local_10,__urng,&local_10._M_param);
    return CONCAT44(extraout_var,rVar1);
  }
  return 0;
}

Assistant:

std::uint32_t random(std::uint32_t const max)
	{
		if (max == 0) return 0;
#ifdef BOOST_NO_CXX11_THREAD_LOCAL
		std::lock_guard<std::mutex> l(rng_mutex);
#endif
#ifdef TORRENT_BUILD_SIMULATOR
		std::uint32_t mask = max | (max >> 16);
		mask |= mask >> 8;
		mask |= mask >> 4;
		mask |= mask >> 2;
		mask |= mask >> 1;
		auto& rng = aux::random_engine();
		std::uint32_t ret;
		do
		{
			ret = rng() & mask;
		} while (ret > max);
#else
		auto const ret = std::uniform_int_distribution<std::uint32_t>(0, max)(aux::random_engine());
#endif
		return ret;
	}